

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Infector_single.hpp
# Opt level: O0

void __thiscall Infector::Container::bindSingleAs<concreteA,IA>(Container *this)

{
  bool bVar1;
  AnyShared<concreteA,_IA> *this_00;
  mapped_type *ppIVar2;
  mapped_type local_90;
  exception *ex_1;
  _Node_iterator_base<std::pair<const_std::type_index,_Infector::IAnyShared_*>,_false> local_48;
  type_index local_40;
  _Node_iterator_base<std::pair<const_std::type_index,_Infector::IAnyShared_*>,_false> local_38 [2];
  exception *ex;
  undefined1 local_12;
  undefined1 local_11;
  bool success;
  Container *pCStack_10;
  bool tests;
  Container *this_local;
  
  pCStack_10 = this;
  local_11 = type_tests<concreteA,IA>();
  local_12 = 0;
  local_12 = resolve_multiple_inheritance<concreteA,IA>(this);
  if (!(bool)local_12) {
    launch_exception<Infector::ExExistingInterface>(this);
  }
  std::type_index::type_index(&local_40,(type_info *)&concreteA::typeinfo);
  local_38[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::type_index,_Infector::IAnyShared_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_Infector::IAnyShared_*>_>_>
       ::find(&this->singleIstances,&local_40);
  local_48._M_cur =
       (__node_type *)
       std::
       unordered_map<std::type_index,_Infector::IAnyShared_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_Infector::IAnyShared_*>_>_>
       ::end(&this->singleIstances);
  bVar1 = std::__detail::operator==(local_38,&local_48);
  if (bVar1) {
    this_00 = (AnyShared<concreteA,_IA> *)operator_new(0x58);
    memset(this_00,0,0x58);
    AnyShared<concreteA,_IA>::AnyShared(this_00);
    local_90 = (mapped_type)0x0;
    if (this_00 != (AnyShared<concreteA,_IA> *)0x0) {
      local_90 = (mapped_type)(&this_00->field_0x0 + *(long *)(*(long *)this_00 + -0x38));
    }
    std::type_index::type_index((type_index *)&ex_1,(type_info *)&concreteA::typeinfo);
    ppIVar2 = std::
              unordered_map<std::type_index,_Infector::IAnyShared_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_Infector::IAnyShared_*>_>_>
              ::operator[](&this->singleIstances,(type_index *)&ex_1);
    *ppIVar2 = local_90;
  }
  return;
}

Assistant:

void Container::bindSingleAs(){
        bool tests = type_tests<T,Contracts...>(); // Compile time tests.
        (void) tests;  //fix unused variable warning

        bool success = false;
        try{
            success = resolve_multiple_inheritance<T,Contracts...>();
        }catch(std::exception & ex){
            rollback_multiple_inheritance<T,Contracts...>(); //revert changes
            throw ex;
        }catch(...){
            rollback_multiple_inheritance<T,Contracts...>(); //revert changes
            launch_exception<ExUnkownException>();
        }


        if(!success) //no changes.
            launch_exception<ExExistingInterface>();

        try{
            if(singleIstances.find( std::type_index(typeid(T)) )
                                    ==singleIstances.end())
                singleIstances[std::type_index(typeid(T))]
                               = new AnyShared<T,Contracts...>();
        }catch(std::exception & ex){
            rollback_multiple_inheritance<T,Contracts...>(); //revert changes
            throw ex;
        }catch(...){
            rollback_multiple_inheritance<T,Contracts...>(); //revert changes
            launch_exception<ExUnkownException>();
        }
    }